

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void verifyOrthonormal<float>(Matrix44<float> *A)

{
  Matrix44<float> *pMVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  int j;
  int i;
  Matrix44<float> prod;
  float valueEps;
  int local_94;
  undefined4 in_stack_ffffffffffffff70;
  int i_00;
  undefined4 in_stack_ffffffffffffff74;
  Matrix44<float> *in_stack_ffffffffffffff78;
  Matrix44<float> *in_stack_ffffffffffffff98;
  Matrix44<float> local_4c;
  float local_c;
  
  local_c = std::numeric_limits<float>::epsilon();
  local_c = local_c * 100.0;
  Imath_2_5::Matrix44<float>::transposed(in_stack_ffffffffffffff98);
  Imath_2_5::Matrix44<float>::operator*
            (in_stack_ffffffffffffff78,
             (Matrix44<float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  i_00 = 0;
  do {
    if (3 < i_00) {
      return;
    }
    for (local_94 = 0; local_94 < 4; local_94 = local_94 + 1) {
      if (i_00 == local_94) {
        pMVar1 = &local_4c;
        Imath_2_5::Matrix44<float>::operator[](pMVar1,i_00);
        std::abs((int)pMVar1);
        if (1.1920929e-05 < extraout_XMM0_Da) {
          __assert_fail("std::abs (prod[i][j] - 1) <= valueEps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                        ,0x4d,"void verifyOrthonormal(const Imath_2_5::Matrix44<T> &) [T = float]");
        }
      }
      else {
        pMVar1 = &local_4c;
        Imath_2_5::Matrix44<float>::operator[](pMVar1,i_00);
        std::abs((int)pMVar1);
        if (1.1920929e-05 < extraout_XMM0_Da_00) {
          __assert_fail("std::abs (prod[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                        ,0x4f,"void verifyOrthonormal(const Imath_2_5::Matrix44<T> &) [T = float]");
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    const T valueEps = T(100) * std::numeric_limits<T>::epsilon();

    const IMATH_INTERNAL_NAMESPACE::Matrix44<T> prod = A * A.transposed();
    for (int i = 0; i < 4; ++i)
    {
        for (int j = 0; j < 4; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) <= valueEps);
            else
                assert (std::abs (prod[i][j]) <= valueEps);
        }
    }
}